

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChromaticities.cpp
# Opt level: O0

M44f * Imf_2_5::RGBtoXYZ(Chromaticities *chroma,float Y)

{
  float *pfVar1;
  float *in_RSI;
  Matrix44<float> *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float Sb;
  float Sg;
  float Sr;
  float d;
  float Z;
  float X;
  M44f *M;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  fVar2 = (in_RSI[6] * in_XMM0_Da) / in_RSI[7];
  fVar3 = (((1.0 - in_RSI[6]) - in_RSI[7]) * in_XMM0_Da) / in_RSI[7];
  fVar4 = in_RSI[2] * (in_RSI[1] - in_RSI[5]) +
          *in_RSI * (in_RSI[5] - in_RSI[3]) + in_RSI[4] * (in_RSI[3] - in_RSI[1]);
  fVar5 = (in_RSI[4] * (in_XMM0_Da * (in_RSI[3] - 1.0) + in_RSI[3] * (fVar2 + fVar3)) +
          fVar2 * (in_RSI[5] - in_RSI[3]) +
          -(in_RSI[2] * (in_XMM0_Da * (in_RSI[5] - 1.0) + in_RSI[5] * (fVar2 + fVar3)))) / fVar4;
  fVar6 = (-in_RSI[4] * (in_XMM0_Da * (in_RSI[1] - 1.0) + in_RSI[1] * (fVar2 + fVar3)) +
          fVar2 * (in_RSI[1] - in_RSI[5]) +
          *in_RSI * (in_XMM0_Da * (in_RSI[5] - 1.0) + in_RSI[5] * (fVar2 + fVar3))) / fVar4;
  fVar4 = (in_RSI[2] * (in_XMM0_Da * (in_RSI[1] - 1.0) + in_RSI[1] * (fVar2 + fVar3)) +
          fVar2 * (in_RSI[3] - in_RSI[1]) +
          -(*in_RSI * (in_XMM0_Da * (in_RSI[3] - 1.0) + in_RSI[3] * (fVar2 + fVar3)))) / fVar4;
  Imath_2_5::Matrix44<float>::Matrix44
            ((Matrix44<float> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  fVar2 = *in_RSI;
  pfVar1 = Imath_2_5::Matrix44<float>::operator[](in_RDI,0);
  *pfVar1 = fVar5 * fVar2;
  fVar2 = in_RSI[1];
  pfVar1 = Imath_2_5::Matrix44<float>::operator[](in_RDI,0);
  pfVar1[1] = fVar5 * fVar2;
  fVar5 = fVar5 * ((1.0 - *in_RSI) - in_RSI[1]);
  pfVar1 = Imath_2_5::Matrix44<float>::operator[](in_RDI,0);
  pfVar1[2] = fVar5;
  fVar2 = fVar6 * in_RSI[2];
  pfVar1 = Imath_2_5::Matrix44<float>::operator[](in_RDI,1);
  *pfVar1 = fVar2;
  fVar2 = in_RSI[3];
  pfVar1 = Imath_2_5::Matrix44<float>::operator[](in_RDI,1);
  pfVar1[1] = fVar6 * fVar2;
  fVar2 = in_RSI[2];
  fVar3 = in_RSI[3];
  pfVar1 = Imath_2_5::Matrix44<float>::operator[](in_RDI,1);
  pfVar1[2] = fVar6 * ((1.0 - fVar2) - fVar3);
  fVar2 = in_RSI[4];
  pfVar1 = Imath_2_5::Matrix44<float>::operator[](in_RDI,2);
  *pfVar1 = fVar4 * fVar2;
  fVar2 = in_RSI[5];
  pfVar1 = Imath_2_5::Matrix44<float>::operator[](in_RDI,2);
  pfVar1[1] = fVar4 * fVar2;
  fVar2 = in_RSI[4];
  fVar3 = in_RSI[5];
  pfVar1 = Imath_2_5::Matrix44<float>::operator[](in_RDI,2);
  pfVar1[2] = fVar4 * ((1.0 - fVar2) - fVar3);
  return in_RDI;
}

Assistant:

IMATH_NAMESPACE::M44f
RGBtoXYZ (const Chromaticities &chroma, float Y)
{
    //
    // For an explanation of how the color conversion matrix is derived,
    // see Roy Hall, "Illumination and Color in Computer Generated Imagery",
    // Springer-Verlag, 1989, chapter 3, "Perceptual Response"; and 
    // Charles A. Poynton, "A Technical Introduction to Digital Video",
    // John Wiley & Sons, 1996, chapter 7, "Color science for video".
    //

    //
    // X and Z values of RGB value (1, 1, 1), or "white"
    //

    float X = chroma.white.x * Y / chroma.white.y;
    float Z = (1 - chroma.white.x - chroma.white.y) * Y / chroma.white.y;

    //
    // Scale factors for matrix rows
    //

    float d = chroma.red.x   * (chroma.blue.y  - chroma.green.y) +
	      chroma.blue.x  * (chroma.green.y - chroma.red.y) +
	      chroma.green.x * (chroma.red.y   - chroma.blue.y);

    float Sr = (X * (chroma.blue.y - chroma.green.y) -
	        chroma.green.x * (Y * (chroma.blue.y - 1) +
		chroma.blue.y  * (X + Z)) +
		chroma.blue.x  * (Y * (chroma.green.y - 1) +
		chroma.green.y * (X + Z))) / d;

    float Sg = (X * (chroma.red.y - chroma.blue.y) +
		chroma.red.x   * (Y * (chroma.blue.y - 1) +
		chroma.blue.y  * (X + Z)) -
		chroma.blue.x  * (Y * (chroma.red.y - 1) +
		chroma.red.y   * (X + Z))) / d;

    float Sb = (X * (chroma.green.y - chroma.red.y) -
		chroma.red.x   * (Y * (chroma.green.y - 1) +
		chroma.green.y * (X + Z)) +
		chroma.green.x * (Y * (chroma.red.y - 1) +
		chroma.red.y   * (X + Z))) / d;

    //
    // Assemble the matrix
    //

    IMATH_NAMESPACE::M44f M;

    M[0][0] = Sr * chroma.red.x;
    M[0][1] = Sr * chroma.red.y;
    M[0][2] = Sr * (1 - chroma.red.x - chroma.red.y);

    M[1][0] = Sg * chroma.green.x;
    M[1][1] = Sg * chroma.green.y;
    M[1][2] = Sg * (1 - chroma.green.x - chroma.green.y);

    M[2][0] = Sb * chroma.blue.x;
    M[2][1] = Sb * chroma.blue.y;
    M[2][2] = Sb * (1 - chroma.blue.x - chroma.blue.y);

    return M;
}